

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O0

int create_intarray(lua_State *L)

{
  int iVar1;
  lua_Integer lVar2;
  undefined8 local_30;
  int size;
  lua_Integer init_value;
  int n;
  lua_State *L_local;
  
  iVar1 = lua_gettop(L);
  if (iVar1 == 2) {
    local_30 = luaL_checkinteger(L,2);
  }
  else {
    local_30 = 0;
  }
  lVar2 = luaL_checkinteger(L,1);
  ravi_create_integer_array(L,(int)lVar2,local_30);
  return 1;
}

Assistant:

static int create_intarray(lua_State *L) {
  int n = lua_gettop(L);
  lua_Integer init_value = (n == 2 ? luaL_checkinteger(L, 2) : 0);
  int size = (int)luaL_checkinteger(L, 1);
  ravi_create_integer_array(L, size, init_value);
  return 1;
}